

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O0

void __thiscall ImGuizmo::matrix_t::RotationAxis(matrix_t *this,vec_t *axis,float angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vec_t vVar7;
  float zs;
  float ys;
  float xs;
  float zx;
  float yz;
  float xy;
  float zz;
  float yy;
  float xx;
  float k;
  float c;
  float s;
  vec_t n;
  float length2;
  float angle_local;
  vec_t *axis_local;
  matrix_t *this_local;
  
  fVar1 = vec_t::LengthSq(axis);
  if (1.1920929e-07 <= fVar1) {
    fVar1 = sqrtf(fVar1);
    vVar7 = vec_t::operator*(axis,1.0 / fVar1);
    fVar1 = sinf(angle);
    fVar2 = cosf(angle);
    fVar3 = 1.0 - fVar2;
    c = vVar7.x;
    s = vVar7.y;
    n.x = vVar7.z;
    fVar4 = c * s * fVar3;
    fVar5 = s * n.x * fVar3;
    fVar6 = n.x * c * fVar3;
    (this->field_0).m[0][0] = c * c * fVar3 + fVar2;
    (this->field_0).m[0][1] = fVar4 + n.x * fVar1;
    (this->field_0).m[0][2] = fVar6 - s * fVar1;
    (this->field_0).m[0][3] = 0.0;
    (this->field_0).m[1][0] = fVar4 - n.x * fVar1;
    (this->field_0).m[1][1] = s * s * fVar3 + fVar2;
    (this->field_0).m[1][2] = fVar5 + c * fVar1;
    (this->field_0).m[1][3] = 0.0;
    (this->field_0).m[2][0] = fVar6 + s * fVar1;
    (this->field_0).m[2][1] = fVar5 - c * fVar1;
    (this->field_0).m[2][2] = n.x * n.x * fVar3 + fVar2;
    (this->field_0).m[2][3] = 0.0;
    (this->field_0).m[3][0] = 0.0;
    (this->field_0).m[3][1] = 0.0;
    (this->field_0).m[3][2] = 0.0;
    (this->field_0).m[3][3] = 1.0;
  }
  else {
    SetToIdentity(this);
  }
  return;
}

Assistant:

void matrix_t::RotationAxis(const vec_t & axis, float angle)
   {
      float length2 = axis.LengthSq();
      if (length2 < FLT_EPSILON)
      {
         SetToIdentity();
         return;
      }

      vec_t n = axis * (1.f / sqrtf(length2));
      float s = sinf(angle);
      float c = cosf(angle);
      float k = 1.f - c;

      float xx = n.x * n.x * k + c;
      float yy = n.y * n.y * k + c;
      float zz = n.z * n.z * k + c;
      float xy = n.x * n.y * k;
      float yz = n.y * n.z * k;
      float zx = n.z * n.x * k;
      float xs = n.x * s;
      float ys = n.y * s;
      float zs = n.z * s;

      m[0][0] = xx;
      m[0][1] = xy + zs;
      m[0][2] = zx - ys;
      m[0][3] = 0.f;
      m[1][0] = xy - zs;
      m[1][1] = yy;
      m[1][2] = yz + xs;
      m[1][3] = 0.f;
      m[2][0] = zx + ys;
      m[2][1] = yz - xs;
      m[2][2] = zz;
      m[2][3] = 0.f;
      m[3][0] = 0.f;
      m[3][1] = 0.f;
      m[3][2] = 0.f;
      m[3][3] = 1.f;
   }